

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

int ncnn::convolution(Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
                     int kernel_h,int stride_w,int stride_h,int dilation_w,int dilation_h,
                     int activation_type,Mat *activation_params,Option *opt)

{
  float fVar1;
  float *pfVar2;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  long *in_stack_00000030;
  float wt;
  float val;
  int k;
  float *sptr;
  Mat m_1;
  int q;
  float *kptr;
  float sum;
  int j_1;
  int i_1;
  float *outptr;
  int p;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int bias_term;
  int outch;
  int outh;
  int outw;
  int inch;
  int w;
  Mat *m;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  Mat *m_2;
  float local_434;
  allocator_type *in_stack_fffffffffffffbd0;
  size_type in_stack_fffffffffffffbd8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffbe0;
  bool local_3ad;
  int local_3a4;
  undefined8 local_398;
  undefined8 local_390;
  undefined8 local_388;
  undefined4 local_380;
  long local_378;
  undefined4 local_370;
  undefined4 local_36c;
  undefined4 local_368;
  undefined4 local_364;
  undefined4 local_360;
  undefined8 local_358;
  int local_34c;
  long local_348;
  float local_33c;
  int local_338;
  int local_334;
  undefined8 local_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined4 local_318;
  long local_310;
  undefined4 local_308;
  undefined4 local_304;
  undefined4 local_300;
  undefined4 local_2fc;
  undefined4 local_2f8;
  undefined8 local_2f0;
  long local_2e8;
  int local_2e0;
  int local_2dc;
  int local_2d8;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  reference local_2c8;
  vector<int,_std::allocator<int>_> local_2a8;
  int local_28c;
  uint local_288;
  int local_284;
  int local_280;
  int local_27c;
  int local_278;
  int local_274;
  int local_270;
  int local_26c;
  long *local_268;
  long *local_260;
  long *local_258;
  long *local_250;
  undefined8 *local_248;
  undefined8 *local_238;
  undefined1 local_21d;
  int local_21c;
  undefined8 *local_210;
  long local_200;
  long *local_1f8;
  float local_1ec;
  float local_1e8;
  float local_1e4;
  float local_1e0;
  float local_1dc;
  float local_1d8;
  float local_1d4;
  float local_1d0;
  float local_1cc;
  long *local_1c8;
  float local_1bc [3];
  long *local_1b0;
  undefined8 local_1a8;
  long *local_1a0;
  undefined8 local_198;
  long *local_190;
  undefined8 local_188;
  long *local_180;
  undefined8 local_178;
  long *local_170;
  undefined8 *local_140;
  undefined8 *local_120;
  undefined8 *local_e8;
  long *local_e0;
  undefined1 local_d5;
  int local_d4;
  undefined8 *local_c8;
  int local_9c;
  undefined8 *local_98;
  long local_90;
  undefined4 local_84;
  long local_80;
  long local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  long local_58;
  undefined4 local_4c;
  long local_48;
  long local_40;
  undefined4 local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  undefined8 extraout_XMM0_Qb;
  
  local_274 = *(int *)((long)in_RDI + 0x2c);
  local_278 = (int)in_RDI[7];
  local_27c = *(int *)((long)in_RSI + 0x2c);
  local_280 = (int)in_RSI[6];
  local_284 = (int)in_RSI[7];
  local_3ad = true;
  if (*in_RCX != 0) {
    local_3ad = in_RCX[8] * (long)(int)in_RCX[7] == 0;
  }
  local_288 = (byte)~local_3ad & 1;
  local_28c = in_R8D * in_R9D;
  local_270 = in_R9D;
  local_26c = in_R8D;
  local_268 = in_RCX;
  local_260 = in_RDX;
  local_258 = in_RSI;
  local_250 = in_RDI;
  std::allocator<int>::allocator((allocator<int> *)0x23c698);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  std::allocator<int>::~allocator((allocator<int> *)0x23c6c4);
  local_2c8 = std::vector<int,_std::allocator<int>_>::operator[](&local_2a8,0);
  local_2cc = 0;
  local_2d0 = 0;
  local_2d4 = local_274 * in_stack_00000020 - local_26c * in_stack_00000018;
  for (local_2d8 = 0; local_2d8 < local_270; local_2d8 = local_2d8 + 1) {
    for (local_2dc = 0; local_2dc < local_26c; local_2dc = local_2dc + 1) {
      local_2c8[local_2cc] = local_2d0;
      local_2cc = local_2cc + 1;
      local_2d0 = in_stack_00000018 + local_2d0;
    }
    local_2d0 = local_2d4 + local_2d0;
  }
  for (local_2e0 = 0; local_2e0 < local_284; local_2e0 = local_2e0 + 1) {
    local_210 = &local_330;
    local_2c = *(int *)((long)local_258 + 0x2c);
    local_30 = (int)local_258[6];
    local_34 = *(undefined4 *)((long)local_258 + 0x34);
    local_2e8 = *local_258 + local_258[8] * (long)local_2e0 * local_258[2];
    local_48 = local_258[2];
    local_4c = (undefined4)local_258[3];
    local_58 = local_258[4];
    local_28 = &local_330;
    local_18 = (long)local_2c * (long)local_30 * local_48;
    local_e8 = &local_330;
    local_248 = &local_330;
    local_1c = 0x10;
    local_21c = local_2e0;
    local_21d = 1;
    local_330 = 0;
    local_320 = 0;
    local_318 = 0;
    local_308 = 0;
    local_304 = 0;
    local_300 = 0;
    local_2fc = 0;
    local_2f8 = 0;
    local_2f0 = 0;
    local_328 = 0;
    local_120 = local_248;
    local_40 = local_2e8;
    local_310 = local_58;
    for (local_334 = 0; local_334 < local_280; local_334 = local_334 + 1) {
      for (local_338 = 0; local_338 < local_27c; local_338 = local_338 + 1) {
        local_33c = 0.0;
        if (local_288 != 0) {
          local_200 = (long)local_2e0;
          local_1f8 = local_268;
          local_33c = *(float *)(*local_268 + local_200 * 4);
        }
        local_e0 = local_260;
        local_348 = *local_260 + (long)(local_28c * local_278 * local_2e0) * 4;
        for (local_34c = 0; fVar1 = local_33c, local_34c < local_278; local_34c = local_34c + 1) {
          local_c8 = &local_398;
          local_64 = *(int *)((long)local_250 + 0x2c);
          local_68 = (int)local_250[6];
          local_6c = *(undefined4 *)((long)local_250 + 0x34);
          local_78 = *local_250 + local_250[8] * (long)local_34c * local_250[2];
          local_80 = local_250[2];
          local_84 = (undefined4)local_250[3];
          local_90 = local_250[4];
          local_60 = &local_398;
          local_8 = (long)local_64 * (long)local_68 * local_80;
          local_9c = local_334 * in_stack_00000010;
          local_98 = &local_398;
          for (local_3a4 = 0; local_3a4 < local_28c; local_3a4 = local_3a4 + 1) {
            local_33c = *(float *)(local_78 + (long)local_64 * (long)local_9c * local_80 +
                                   (long)(local_338 * in_stack_00000008) * 4 +
                                  (long)local_2c8[local_3a4] * 4) *
                        *(float *)(local_348 + (long)local_3a4 * 4) + local_33c;
          }
          local_348 = local_348 + (long)local_28c * 4;
          local_238 = &local_398;
          local_c = 0x10;
          local_d4 = local_34c;
          local_d5 = 1;
          local_398 = 0;
          local_388 = 0;
          local_380 = 0;
          local_370 = 0;
          local_36c = 0;
          local_368 = 0;
          local_364 = 0;
          local_360 = 0;
          local_358 = 0;
          local_390 = 0;
          local_140 = local_238;
          local_378 = local_90;
        }
        local_1bc[0] = local_33c;
        local_1c8 = in_stack_00000030;
        in_stack_fffffffffffffbd0 = (allocator_type *)(ulong)(in_stack_00000028 - 1);
        switch(in_stack_fffffffffffffbd0) {
        case (allocator_type *)0x0:
          dVar3 = std::fmax((double)(ulong)(uint)local_33c,0.0);
          local_1bc[0] = SUB84(dVar3,0);
          break;
        case (allocator_type *)0x1:
          local_170 = in_stack_00000030;
          local_178 = 0;
          local_1cc = *(float *)*in_stack_00000030;
          if (local_33c <= 0.0) {
            local_434 = local_33c * local_1cc;
          }
          else {
            local_434 = local_33c;
          }
          local_1bc[0] = local_434;
          break;
        case (allocator_type *)0x2:
          local_180 = in_stack_00000030;
          local_188 = 0;
          local_1d0 = *(float *)*in_stack_00000030;
          local_190 = in_stack_00000030;
          local_198 = 1;
          local_1d4 = *(float *)(*in_stack_00000030 + 4);
          if (local_33c < local_1d0) {
            local_1bc[0] = local_1d0;
          }
          if (local_1d4 < local_1bc[0]) {
            local_1bc[0] = local_1d4;
          }
          break;
        case (allocator_type *)0x3:
          local_1d8 = 88.37626;
          pfVar2 = std::min<float>(local_1bc,&local_1d8);
          local_1bc[0] = *pfVar2;
          local_1dc = -88.37626;
          pfVar2 = std::max<float>(local_1bc,&local_1dc);
          local_1bc[0] = *pfVar2;
          dVar3 = std::exp((double)(ulong)(uint)-local_1bc[0]);
          local_1bc[0] = 1.0 / (SUB84(dVar3,0) + 1.0);
          break;
        case (allocator_type *)0x4:
          auVar4._0_8_ = std::exp((double)(ulong)(uint)local_33c);
          auVar4._8_8_ = extraout_XMM0_Qb;
          auVar5._4_12_ = auVar4._4_12_;
          auVar5._0_4_ = SUB84(auVar4._0_8_,0) + 1.0;
          dVar3 = std::log(auVar5._0_8_);
          dVar3 = std::tanh(dVar3);
          local_1bc[0] = fVar1 * SUB84(dVar3,0);
          break;
        case (allocator_type *)0x5:
          local_1a0 = in_stack_00000030;
          local_1a8 = 0;
          local_1e0 = *(float *)*in_stack_00000030;
          local_1b0 = in_stack_00000030;
          local_1bc[1] = 1.4013e-45;
          local_1bc[2] = 0.0;
          local_1e4 = *(float *)(*in_stack_00000030 + 4);
          local_1e8 = -local_1e4 / local_1e0;
          local_1ec = 1.0 / local_1e0 + local_1e8;
          if (local_1e8 <= local_33c) {
            if (local_33c <= local_1ec) {
              local_1bc[0] = local_33c * (local_33c * local_1e0 + local_1e4);
            }
          }
          else {
            local_1bc[0] = 0.0;
          }
        }
        *(float *)(local_2e8 + (long)local_338 * 4) = local_1bc[0];
      }
      local_2e8 = local_2e8 + (long)local_27c * 4;
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbd0);
  return 0;
}

Assistant:

static int convolution(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int kernel_h, int stride_w, int stride_h, int dilation_w, int dilation_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int w = bottom_blob.w;
    const int inch = bottom_blob.c;

    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int bias_term = bias_data.empty() ? 0 : 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                const float* kptr = (const float*)weight_data + maxk * inch * p;

                for (int q = 0; q < inch; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    const float* sptr = m.row(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++) // 29.23
                    {
                        float val = sptr[space_ofs[k]]; // 20.72
                        float wt = kptr[k];
                        sum += val * wt; // 41.45
                    }

                    kptr += maxk;
                }

                outptr[j] = activation_ss(sum, activation_type, activation_params);
            }

            outptr += outw;
        }
    }

    return 0;
}